

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O3

int h264_mvd(bitstream *str,h264_cabac_context *cabac,int idx,int comp,int which,int32_t *val)

{
  uint uVar1;
  int iVar2;
  h264_macroblock *phVar3;
  h264_macroblock *phVar4;
  uint uVar5;
  uint uVar6;
  int ctxIdx [5];
  int idxA;
  h264_macroblock *local_68;
  bitstream *local_60;
  int32_t *local_58;
  int idxB;
  int local_48;
  int local_44;
  int iStack_40;
  int iStack_3c;
  int iStack_38;
  
  if (cabac != (h264_cabac_context *)0x0) {
    local_60 = str;
    local_58 = val;
    local_68 = h264_mb_nb(cabac->slice,H264_MB_THIS,0);
    phVar3 = h264_mb_nb_b(cabac->slice,H264_MB_A,H264_BLOCK_4X4,0,idx,&idxA);
    phVar4 = h264_mb_nb_b(cabac->slice,H264_MB_B,H264_BLOCK_4X4,0,idx,&idxB);
    uVar1 = phVar3->mvd[which][idxA][comp];
    uVar5 = -uVar1;
    if (0 < (int)uVar1) {
      uVar5 = uVar1;
    }
    uVar1 = phVar4->mvd[which][idxB][comp];
    uVar6 = -uVar1;
    if (0 < (int)uVar1) {
      uVar6 = uVar1;
    }
    iStack_38 = 0x28;
    if (comp != 0) {
      iStack_38 = 0x2f;
      if (local_68->mb_field_decoding_flag == 0) {
        uVar5 = uVar5 << (phVar3->mb_field_decoding_flag != 0);
        uVar6 = uVar6 << (phVar4->mb_field_decoding_flag != 0);
      }
      else {
        uVar5 = uVar5 >> (phVar3->mb_field_decoding_flag == 0);
        uVar6 = uVar6 >> (phVar4->mb_field_decoding_flag == 0);
      }
    }
    local_48 = (0x20 < (int)(uVar5 + uVar6)) + 1;
    if ((int)(uVar5 + uVar6) < 3) {
      local_48 = 0;
    }
    local_48 = local_48 + iStack_38;
    local_44 = iStack_38 + 3;
    iStack_40 = iStack_38 + 4;
    iStack_3c = iStack_38 + 5;
    iStack_38 = iStack_38 + 6;
    iVar2 = h264_cabac_ueg(local_60,cabac,&local_48,5,3,1,9,local_58);
    return iVar2;
  }
  iVar2 = vs_se(str,val);
  return iVar2;
}

Assistant:

int h264_mvd(struct bitstream *str, struct h264_cabac_context *cabac, int idx, int comp, int which, int32_t *val) {
	if (!cabac)
		return vs_se(str, val);
	int baseidx = (comp ? H264_CABAC_CTXIDX_MVD_Y : H264_CABAC_CTXIDX_MVD_X);
	int idxA, idxB;
	const struct h264_macroblock *mbT = h264_mb_nb(cabac->slice, H264_MB_THIS, 0);
	const struct h264_macroblock *mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_4X4, 0, idx, &idxA);
	const struct h264_macroblock *mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_4X4, 0, idx, &idxB);
	int absMvdCompA = abs(mbA->mvd[which][idxA][comp]);
	int absMvdCompB = abs(mbB->mvd[which][idxB][comp]);
	if (comp) {
		if (mbT->mb_field_decoding_flag && !mbA->mb_field_decoding_flag)
			absMvdCompA /= 2;
		if (!mbT->mb_field_decoding_flag && mbA->mb_field_decoding_flag)
			absMvdCompA *= 2;
		if (mbT->mb_field_decoding_flag && !mbB->mb_field_decoding_flag)
			absMvdCompB /= 2;
		if (!mbT->mb_field_decoding_flag && mbB->mb_field_decoding_flag)
			absMvdCompB *= 2;
	}
	int sum = absMvdCompA + absMvdCompB;
	int inc;
	if (sum < 3)
		inc = 0;
	else if (sum <= 32)
		inc = 1;
	else
		inc = 2;
	int ctxIdx[5];
	ctxIdx[0] = baseidx + inc;
	ctxIdx[1] = baseidx + 3;
	ctxIdx[2] = baseidx + 4;
	ctxIdx[3] = baseidx + 5;
	ctxIdx[4] = baseidx + 6;
	return h264_cabac_ueg(str, cabac, ctxIdx, 5, 3, 1, 9, val);
}